

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.h
# Opt level: O0

void __thiscall booster::aio::const_buffer::const_buffer(const_buffer *this,mutable_buffer *other)

{
  buffer_impl<const_char_*> *this_00;
  pair<const_booster::aio::buffer_impl<char_*>::entry_*,_unsigned_long> pVar1;
  uint i;
  buffer_data_type data;
  uint uVar2;
  undefined4 in_stack_ffffffffffffffd4;
  char *in_stack_ffffffffffffffd8;
  buffer_impl<char_*> *in_stack_ffffffffffffffe0;
  
  buffer_impl<const_char_*>::buffer_impl((buffer_impl<const_char_*> *)0x120dbc);
  pVar1 = buffer_impl<char_*>::get(in_stack_ffffffffffffffe0);
  this_00 = (buffer_impl<const_char_*> *)pVar1.first;
  for (uVar2 = 0; (ulong)uVar2 < pVar1.second; uVar2 = uVar2 + 1) {
    buffer_impl<const_char_*>::add
              (this_00,in_stack_ffffffffffffffd8,CONCAT44(in_stack_ffffffffffffffd4,uVar2));
  }
  return;
}

Assistant:

const_buffer(mutable_buffer const &other) 
			{
				mutable_buffer::buffer_data_type data = other.get();
				for(unsigned i=0;i<data.second;i++)
					add(data.first[i].ptr,data.first[i].size);
			}